

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

int Cof_ManCountRemoved(Cof_Man_t *p,Cof_Obj_t *pRoot,int fConst1)

{
  uint *puVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  int *piVar8;
  uint *puVar9;
  ulong uVar10;
  uint iLit0;
  long lVar11;
  uint *puVar12;
  int iVar13;
  long lVar14;
  
  uVar4 = p->nTravIds + 1;
  p->nTravIds = uVar4;
  pRoot->Value = uVar4;
  iVar5 = Cof_ObjLevel((Cof_Man_t *)p->pGia,(Cof_Obj_t *)(ulong)(uint)pRoot->Id);
  piVar8 = p->pLevels;
  lVar11 = (long)iVar5;
  if (piVar8[lVar11] != 0) {
    __assert_fail("p->pLevels[LevelStart] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCof.c"
                  ,0x1c8,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
  }
  pRoot->iNext = 0;
  piVar8[lVar11] = (int)((ulong)((long)pRoot - (long)p->pObjData) >> 2);
  if ((uint)fConst1 < 2) {
    pRoot->iLit = fConst1;
    iVar13 = 0;
    if (iVar5 < p->nLevels) {
      iVar13 = 0;
      do {
        uVar4 = piVar8[lVar11];
        if (uVar4 != 0) {
          do {
            uVar2 = p->pObjData[(ulong)uVar4 + 5];
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            puVar1 = (uint *)(p->pObjData + uVar4);
            if (puVar1[3] == uVar2 >> 1) {
              __assert_fail("pTemp->Id != Abc_Lit2Var(pTemp->iLit)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCof.c"
                            ,0x1d4,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
            }
            uVar4 = *puVar1;
            if (0xff < uVar4) {
              lVar14 = 0;
              do {
                uVar6 = (ulong)(puVar1[(ulong)(uVar4 >> 4 & 0xf) + lVar14 + 6] & 0x7fffffff);
                if ((puVar1[uVar6] & 0xf1) != 0x11) {
                  uVar4 = p->nTravIds;
                  if (puVar1[uVar6 + 2] != uVar4) {
                    puVar9 = puVar1 + (uVar6 - ((ulong)puVar1[uVar6 + 6] & 0x7fffffff));
                    puVar12 = puVar1 + (uVar6 - ((ulong)puVar1[uVar6 + 7] & 0x7fffffff));
                    if ((puVar9 != puVar1) && (puVar12 != puVar1)) {
                      __assert_fail("pFanin0 == pTemp || pFanin1 == pTemp",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCof.c"
                                    ,0x1dd,"int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)")
                      ;
                    }
                    uVar2 = puVar1[uVar6 + 3];
                    if (((long)(int)uVar2 < 0) || (p_00 = p->pGia, p_00->nObjs <= (int)uVar2)) {
                      __assert_fail("v >= 0 && v < p->nObjs",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                    }
                    if (puVar9[2] == uVar4) {
                      if ((int)puVar9[5] < 0) goto LAB_0071bf4d;
                      uVar10 = *(ulong *)(p_00->pObjs + (int)uVar2);
                      iLit0 = (uint)(uVar10 >> 0x1d) & 1 ^ puVar9[5];
                    }
                    else {
                      uVar10 = *(ulong *)(p_00->pObjs + (int)uVar2);
                      iVar5 = uVar2 - ((uint)uVar10 & 0x1fffffff);
                      if (iVar5 < 0) goto LAB_0071bf2e;
                      iLit0 = ((uint)(uVar10 >> 0x1d) & 1) + iVar5 * 2;
                    }
                    uVar3 = (uint)(uVar10 >> 0x20);
                    if (puVar12[2] == uVar4) {
                      if ((int)puVar12[5] < 0) {
LAB_0071bf4d:
                        __assert_fail("Lit >= 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                      ,0x132,"int Abc_LitNotCond(int, int)");
                      }
                      uVar4 = uVar3 >> 0x1d & 1 ^ puVar12[5];
                    }
                    else {
                      iVar5 = uVar2 - (uVar3 & 0x1fffffff);
                      if (iVar5 < 0) goto LAB_0071bf2e;
                      uVar4 = (uVar3 >> 0x1d & 1) + iVar5 * 2;
                    }
                    uVar4 = Gia_ManHashAndTry(p_00,iLit0,uVar4);
                    if (uVar4 != 0xffffffff) {
                      puVar1[uVar6 + 2] = p->nTravIds;
                      puVar1[uVar6 + 5] = uVar4;
                      iVar5 = Cof_ObjLevel((Cof_Man_t *)p->pGia,
                                           (Cof_Obj_t *)(ulong)puVar1[uVar6 + 3]);
                      lVar7 = (long)iVar5;
                      if ((lVar7 <= lVar11) || (p->nLevels <= iVar5)) {
                        __assert_fail("LevelNext > i && LevelNext < p->nLevels",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaCof.c"
                                      ,0x1ef,
                                      "int Cof_ManCountRemoved(Cof_Man_t *, Cof_Obj_t *, int)");
                      }
                      piVar8 = p->pLevels;
                      puVar1[uVar6 + 4] = piVar8[lVar7];
                      piVar8[lVar7] = (int)((long)puVar1 + (uVar6 * 4 - (long)p->pObjData) >> 2);
                      iVar13 = iVar13 + 1;
                    }
                  }
                }
                uVar4 = *puVar1;
                lVar14 = lVar14 + 1;
              } while ((uint)lVar14 < uVar4 >> 8);
            }
            uVar4 = puVar1[4];
          } while (uVar4 != 0);
          piVar8 = p->pLevels;
        }
        piVar8[lVar11] = 0;
        lVar11 = lVar11 + 1;
      } while (lVar11 < p->nLevels);
    }
    return iVar13;
  }
LAB_0071bf2e:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Cof_ManCountRemoved( Cof_Man_t * p, Cof_Obj_t * pRoot, int fConst1 )
{
    Gia_Obj_t * pNextGia;
    Cof_Obj_t * pTemp, * pNext, * pFanin0, * pFanin1;
    int Counter = 0, LevelStart, LevelNext;
    int i, k, iHandle, iLit0, iLit1, iNextNew;
    // restart the trav ids
    Cof_ManIncrementTravId( p );
    Cof_ObjSetTravIdCurrent( p, pRoot );
    // add the node to the queue
    LevelStart = Cof_ObjLevel(p, pRoot);
    assert( p->pLevels[LevelStart] == 0 );
    pRoot->iNext = 0;
    p->pLevels[LevelStart] = Cof_ObjHandle( p, pRoot );
    // set the new literal
    pRoot->iLit = Abc_Var2Lit( 0, fConst1 );
    // process nodes in the levelized order
    for ( i = LevelStart; i < p->nLevels; i++ )
    {
        for ( iHandle = p->pLevels[i]; 
              iHandle && (pTemp = Cof_ManObj(p, iHandle)); 
              iHandle = pTemp->iNext )
        {
            assert( pTemp->Id != Abc_Lit2Var(pTemp->iLit) );
            Cof_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( Cof_ObjIsCo(pNext) )
                    continue;
                if ( Cof_ObjIsTravIdCurrent(p, pNext) )
                    continue;
                pFanin0 = Cof_ObjFanin( pNext, 0 );
                pFanin1 = Cof_ObjFanin( pNext, 1 );
                assert( pFanin0 == pTemp || pFanin1 == pTemp );
                pNextGia = Gia_ManObj( p->pGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin0) )
                    iLit0 = Abc_LitNotCond( pFanin0->iLit, Gia_ObjFaninC0(pNextGia) );
                else
                    iLit0 = Gia_ObjFaninLit0( pNextGia, pNext->Id );
                if ( Cof_ObjIsTravIdCurrent(p, pFanin1) )
                    iLit1 = Abc_LitNotCond( pFanin1->iLit, Gia_ObjFaninC1(pNextGia) );
                else
                    iLit1 = Gia_ObjFaninLit1( pNextGia, pNext->Id );
                iNextNew = Gia_ManHashAndTry( p->pGia, iLit0, iLit1 );
                if ( iNextNew == -1 )
                    continue;
                Cof_ObjSetTravIdCurrent(p, pNext);
                // set the new literal
                pNext->iLit = iNextNew;
                // add it to be processed
                LevelNext = Cof_ObjLevel( p, pNext );
                assert( LevelNext > i && LevelNext < p->nLevels );
                pNext->iNext = p->pLevels[LevelNext];
                p->pLevels[LevelNext] = Cof_ObjHandle( p, pNext );
                Counter++;
            }
        }
        p->pLevels[i] = 0;
    }
    return Counter;
}